

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Eq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
::find_or_prepare_insert_non_soo<google::protobuf::EnumValueDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Eq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          *this,EnumValueDescriptor **key)

{
  ctrl_t *pcVar1;
  ushort uVar2;
  bool bVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  uint uVar6;
  uintptr_t v;
  ctrl_t *pcVar7;
  slot_type *ppEVar8;
  size_t sVar9;
  PolicyFunctions *in_R9;
  ushort uVar10;
  ulong uVar11;
  CommonFields *common;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  __m128i match;
  ctrl_t cVar14;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  undefined1 auVar15 [16];
  iterator iVar31;
  FindInfo target;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_70;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    *)this);
  if (bVar3) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = const google::protobuf::EnumValueDescriptor *]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              *)this);
  uVar11 = ((ulong)*key ^ 0x79f430) * -0x234dd359734ecb13;
  uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
            uVar11 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18
            | (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
            (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38);
  probe(&local_70,(CommonFields *)this,(size_t)common);
  pcVar7 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      *)this);
  uVar4 = (undefined1)(uVar11 >> 0x38);
  auVar13 = ZEXT216(CONCAT11(uVar4,uVar4) & 0x7f7f);
  auVar13 = pshuflw(auVar13,auVar13,0);
  uVar12 = auVar13._0_4_;
  local_48._4_4_ = uVar12;
  local_48._0_4_ = uVar12;
  local_48._8_4_ = uVar12;
  local_48._12_4_ = uVar12;
  do {
    pcVar1 = pcVar7 + local_70.offset_;
    auVar13[0] = -(local_48[0] == *pcVar1);
    auVar13[1] = -(local_48[1] == pcVar1[1]);
    auVar13[2] = -(local_48[2] == pcVar1[2]);
    auVar13[3] = -(local_48[3] == pcVar1[3]);
    auVar13[4] = -(local_48[4] == pcVar1[4]);
    auVar13[5] = -(local_48[5] == pcVar1[5]);
    auVar13[6] = -(local_48[6] == pcVar1[6]);
    auVar13[7] = -(local_48[7] == pcVar1[7]);
    auVar13[8] = -(local_48[8] == pcVar1[8]);
    auVar13[9] = -(local_48[9] == pcVar1[9]);
    auVar13[10] = -(local_48[10] == pcVar1[10]);
    auVar13[0xb] = -(local_48[0xb] == pcVar1[0xb]);
    auVar13[0xc] = -(local_48[0xc] == pcVar1[0xc]);
    auVar13[0xd] = -(local_48[0xd] == pcVar1[0xd]);
    auVar13[0xe] = -(local_48[0xe] == pcVar1[0xe]);
    auVar13[0xf] = -(local_48[0xf] == pcVar1[0xf]);
    cVar14 = *pcVar1;
    cVar16 = pcVar1[1];
    cVar17 = pcVar1[2];
    cVar18 = pcVar1[3];
    cVar19 = pcVar1[4];
    cVar20 = pcVar1[5];
    cVar21 = pcVar1[6];
    cVar22 = pcVar1[7];
    cVar23 = pcVar1[8];
    cVar24 = pcVar1[9];
    cVar25 = pcVar1[10];
    cVar26 = pcVar1[0xb];
    cVar27 = pcVar1[0xc];
    cVar28 = pcVar1[0xd];
    cVar29 = pcVar1[0xe];
    cVar30 = pcVar1[0xf];
    for (uVar10 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar13[0xf] >> 7) << 0xf; uVar10 != 0; uVar10 = uVar10 - 1 & uVar10) {
      local_58 = cVar14;
      cStack_57 = cVar16;
      cStack_56 = cVar17;
      cStack_55 = cVar18;
      cStack_54 = cVar19;
      cStack_53 = cVar20;
      cStack_52 = cVar21;
      cStack_51 = cVar22;
      cStack_50 = cVar23;
      cStack_4f = cVar24;
      cStack_4e = cVar25;
      cStack_4d = cVar26;
      cStack_4c = cVar27;
      cStack_4b = cVar28;
      cStack_4a = cVar29;
      cStack_49 = cVar30;
      uVar5 = TrailingZeros<unsigned_short>(uVar10);
      ppEVar8 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              *)this);
      sVar9 = uVar5 + local_70.offset_ & local_70.mask_;
      if (ppEVar8[sVar9] == *key) {
        bVar3 = false;
        goto LAB_002aa3bc;
      }
      cVar14 = local_58;
      cVar16 = cStack_57;
      cVar17 = cStack_56;
      cVar18 = cStack_55;
      cVar19 = cStack_54;
      cVar20 = cStack_53;
      cVar21 = cStack_52;
      cVar22 = cStack_51;
      cVar23 = cStack_50;
      cVar24 = cStack_4f;
      cVar25 = cStack_4e;
      cVar26 = cStack_4d;
      cVar27 = cStack_4c;
      cVar28 = cStack_4b;
      cVar29 = cStack_4a;
      cVar30 = cStack_49;
    }
    auVar15[0] = -(cVar14 == kEmpty);
    auVar15[1] = -(cVar16 == kEmpty);
    auVar15[2] = -(cVar17 == kEmpty);
    auVar15[3] = -(cVar18 == kEmpty);
    auVar15[4] = -(cVar19 == kEmpty);
    auVar15[5] = -(cVar20 == kEmpty);
    auVar15[6] = -(cVar21 == kEmpty);
    auVar15[7] = -(cVar22 == kEmpty);
    auVar15[8] = -(cVar23 == kEmpty);
    auVar15[9] = -(cVar24 == kEmpty);
    auVar15[10] = -(cVar25 == kEmpty);
    auVar15[0xb] = -(cVar26 == kEmpty);
    auVar15[0xc] = -(cVar27 == kEmpty);
    auVar15[0xd] = -(cVar28 == kEmpty);
    auVar15[0xe] = -(cVar29 == kEmpty);
    auVar15[0xf] = -(cVar30 == kEmpty);
    uVar10 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf;
    if (uVar10 != 0) {
      sVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          *)this);
      pcVar7 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          *)this);
      bVar3 = ShouldInsertBackwardsForDebug(sVar9,(size_t)common,pcVar7);
      if (bVar3) {
        uVar2 = 0xf;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar6 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar6 = TrailingZeros<unsigned_short>(uVar10);
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_70.index_;
      sVar9 = PrepareInsertNonSoo((container_internal *)this,common,
                                  uVar6 + local_70.offset_ & local_70.mask_,target,in_R9);
      bVar3 = true;
LAB_002aa3bc:
      iVar31 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              *)this,sVar9);
      __return_storage_ptr__->first = iVar31;
      __return_storage_ptr__->second = bVar3;
      return __return_storage_ptr__;
    }
    uVar11 = local_70.index_ + 0x10;
    local_70.offset_ = local_70.index_ + local_70.offset_ + 0x10 & local_70.mask_;
    local_70.index_ = uVar11;
    sVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        *)this);
    if (sVar9 < uVar11) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = const google::protobuf::EnumValueDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }